

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O3

int __thiscall
sptk::reaper::FdFilter::FilterStream(FdFilter *this,FILE *input_stream,FILE *output_stream)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  int16_t *__s;
  int16_t *piVar5;
  int towrite;
  int local_58;
  int local_54;
  FdFilter *local_50;
  FILE *local_48;
  FILE *local_40;
  size_t local_38;
  
  local_38 = (size_t)this->max_input_;
  this->filter_state_ = 1;
  sVar3 = fread(this->input_buffer_,2,local_38,(FILE *)input_stream);
  if ((int)sVar3 == 0) {
    local_58 = 1;
  }
  else {
    local_58 = 1;
    local_50 = this;
    local_48 = (FILE *)input_stream;
    local_40 = (FILE *)output_stream;
    do {
      iVar1 = getc((FILE *)input_stream);
      iVar2 = feof((FILE *)input_stream);
      if (iVar2 == 0) {
        ungetc(iVar1,(FILE *)input_stream);
      }
      else {
        *(byte *)&this->filter_state_ = (byte)this->filter_state_ | 2;
      }
      iVar1 = this->insert_;
      iVar2 = (int)sVar3;
      if (1 < iVar1) {
        piVar5 = this->input_buffer_ + iVar2;
        __s = this->input_buffer_ + (((long)(iVar1 * iVar2) + -1) - (ulong)(iVar1 - 2));
        do {
          piVar5 = piVar5 + -1;
          memset(__s,0,(ulong)(iVar1 - 1) * 2);
          __s[-1] = *piVar5;
          __s = __s + (-2 - (ulong)(iVar1 - 2));
          uVar4 = (int)sVar3 - 1;
          sVar3 = (size_t)uVar4;
          this = local_50;
          output_stream = (FILE *)local_40;
          input_stream = (FILE *)local_48;
        } while (uVar4 != 0);
      }
      FilterBuffer(this,iVar1 * iVar2,&local_54);
      iVar1 = local_54;
      sVar3 = fwrite(this->output_buffer_,2,(long)local_54,(FILE *)output_stream);
      if ((int)sVar3 < iVar1) {
        FilterStream();
        local_58 = 0;
      }
      this->filter_state_ = 0;
      sVar3 = fread(this->input_buffer_,2,local_38,(FILE *)input_stream);
    } while ((int)sVar3 != 0);
  }
  return local_58;
}

Assistant:

int FdFilter::FilterStream(FILE *input_stream, FILE *output_stream) {
  int i, j;
  int  toread, towrite, nread, rVal = 1, testc;

  toread = max_input_;
  filter_state_ = 1;  // indicate start of new signal
  /* process data from a stream */
  while ((nread = fread(input_buffer_, sizeof(*input_buffer_), toread,
                        input_stream))) {
    testc = getc(input_stream);
    if (feof(input_stream))
      filter_state_ |= 2;
    else
      ungetc(testc, input_stream);
    if (insert_ > 1) {
      int16_t *p, *q;
      for (p = input_buffer_ + nread - 1,
               q = input_buffer_ + (nread * insert_) - 1, i = nread; i--;) {
        for (j = insert_ - 1; j--;) *q-- = 0;
        *q-- = *p--;
      }
    }
    FilterBuffer(nread*insert_, &towrite);
    if ((i = fwrite(output_buffer_, sizeof(*output_buffer_), towrite,
                    output_stream)) < towrite) {
      fprintf(stderr, "Problems writing output in FilterStream\n");
      rVal = 0;
    }
    filter_state_ = 0;
  }
  return(rVal);
}